

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

float * glfwGetJoystickAxes(int jid,int *count)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWjoystick *js;
  int *count_local;
  float *pfStack_10;
  int jid_local;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ProjectRage[P]Opengl-setup/libraries/glfw/src/input.c"
                  ,0x3c2,"const float *glfwGetJoystickAxes(int, int *)");
  }
  if (jid < 0x10) {
    if (count != (int *)0x0) {
      *count = 0;
      if (_glfw.initialized == 0) {
        _glfwInputError(0x10001,(char *)0x0);
        pfStack_10 = (float *)0x0;
      }
      else if ((jid < 0) || (0xf < jid)) {
        _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)(uint)jid);
        pfStack_10 = (float *)0x0;
      }
      else {
        GVar1 = initJoysticks();
        if (GVar1 == 0) {
          pfStack_10 = (float *)0x0;
        }
        else if (_glfw.joysticks[jid].present == 0) {
          pfStack_10 = (float *)0x0;
        }
        else {
          iVar2 = _glfwPlatformPollJoystick(_glfw.joysticks + jid,1);
          if (iVar2 == 0) {
            pfStack_10 = (float *)0x0;
          }
          else {
            *count = _glfw.joysticks[jid].axisCount;
            pfStack_10 = _glfw.joysticks[jid].axes;
          }
        }
      }
      return pfStack_10;
    }
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ProjectRage[P]Opengl-setup/libraries/glfw/src/input.c"
                  ,0x3c4,"const float *glfwGetJoystickAxes(int, int *)");
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ProjectRage[P]Opengl-setup/libraries/glfw/src/input.c"
                ,0x3c3,"const float *glfwGetJoystickAxes(int, int *)");
}

Assistant:

GLFWAPI const float* glfwGetJoystickAxes(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_AXES))
        return NULL;

    *count = js->axisCount;
    return js->axes;
}